

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall FormatterTest_FormatInt_Test::TestBody(FormatterTest_FormatInt_Test *this)

{
  bool bVar1;
  char *message;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  AssertionResult local_2a8;
  AssertHelper local_298 [2];
  undefined1 local_288 [16];
  undefined1 *local_278;
  undefined1 local_268 [16];
  undefined8 local_258 [2];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  undefined1 *local_240;
  long lStack_238;
  undefined8 local_230;
  undefined1 local_228 [504];
  
  testing::AssertionSuccess();
  if (local_2a8.success_ == true) {
    local_298[0].data_ = (AssertHelperData *)local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"missing \'}\' in format string","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_258[0] = 0x2a;
      lStack_238 = 0;
      local_248.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_230 = 500;
      format_str.size_ = 4;
      format_str.data_ = "{0:v";
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_258;
      args.types_ = fmt::v5::
                    format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                    ::TYPES;
      local_240 = local_228;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_248,format_str,args,(locale_ref)0x0);
      local_278 = local_268;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,local_240,local_240 + lStack_238);
      local_248.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_240 != local_228) {
        operator_delete(local_240);
      }
      if (local_278 != local_268) {
        operator_delete(local_278);
      }
    }
    testing::AssertionResult::operator<<
              (&local_2a8,
               (char (*) [100])
               "Expected: format(\"{0:v\", 42) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_298[0].data_ != (AssertHelperData *)local_288) {
      operator_delete(local_298[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_248);
  if (local_2a8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((local_2a8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_298,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x544,message);
  testing::internal::AssertHelper::operator=(local_298,(Message *)&local_248);
  testing::internal::AssertHelper::~AssertHelper(local_298);
  if (local_248.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_248.ptr_ + 8))();
    }
    local_248.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_248.ptr_._0_4_ = 0x2a;
  check_unknown_types<int>((int *)&local_248,"bBdoxXn","integer");
  return;
}

Assistant:

TEST(FormatterTest, FormatInt) {
  EXPECT_THROW_MSG(format("{0:v", 42),
      format_error, "missing '}' in format string");
  check_unknown_types(42, "bBdoxXn", "integer");
}